

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void __thiscall google::anon_unknown_10::LogFileObject::~LogFileObject(LogFileObject *this)

{
  Mutex *this_00;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__LogFileObject_0012fb48;
  this_00 = &this->lock_;
  ::glog_internal_namespace_::Mutex::Lock(this_00);
  if ((FILE *)this->file_ != (FILE *)0x0) {
    fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
  }
  ::glog_internal_namespace_::Mutex::Unlock(this_00);
  std::__cxx11::string::~string((string *)&this->filename_extension_);
  std::__cxx11::string::~string((string *)&this->symlink_basename_);
  std::__cxx11::string::~string((string *)&this->base_filename_);
  ::glog_internal_namespace_::Mutex::~Mutex(this_00);
  return;
}

Assistant:

LogFileObject::~LogFileObject() {
  MutexLock l(&lock_);
  if (file_ != NULL) {
    fclose(file_);
    file_ = NULL;
  }
}